

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  int iVar3;
  Fad<double> *pFVar4;
  value_type vVar5;
  value_type vVar6;
  double dVar7;
  
  vVar5 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  iVar3 = (this->right_->fadexpr_).left_.constant_;
  pFVar4 = (this->right_->fadexpr_).right_;
  dVar1 = pFVar4->val_;
  dVar2 = (pFVar4->dx_).ptr_to_data[i];
  vVar6 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::val(&this->left_->fadexpr_);
  dVar7 = (double)(this->right_->fadexpr_).left_.constant_ + ((this->right_->fadexpr_).right_)->val_
  ;
  return (((double)iVar3 + dVar1) * vVar5 - vVar6 * dVar2) / (dVar7 * dVar7);
}

Assistant:

value_type fastAccessDx(int i) const { return (left_.fastAccessDx(i) * right_.val() - right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}